

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.h
# Opt level: O2

bool __thiscall Js::SimpleTypeHandler<3UL>::SupportsPrototypeInstances(SimpleTypeHandler<3UL> *this)

{
  byte bVar1;
  
  if (DAT_0145c366 == '\0') {
    if (((this->super_DynamicTypeHandler).flags & 0x18) == 0) {
      bVar1 = 1;
    }
    else {
      bVar1 = DAT_0145c365 ^ 1;
    }
  }
  else {
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

virtual bool SupportsPrototypeInstances() const { return !ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()); }